

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_init(connectdata *conn)

{
  SessionHandle *pSVar1;
  void *pvVar2;
  SMTP *smtp;
  SessionHandle *data;
  CURLcode result;
  connectdata *conn_local;
  
  data._4_4_ = CURLE_OK;
  pSVar1 = conn->data;
  pvVar2 = (*Curl_ccalloc)(0x28,1);
  (pSVar1->req).protop = pvVar2;
  if (pvVar2 == (void *)0x0) {
    data._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  return data._4_4_;
}

Assistant:

static CURLcode smtp_init(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct SMTP *smtp;

  smtp = data->req.protop = calloc(sizeof(struct SMTP), 1);
  if(!smtp)
    result = CURLE_OUT_OF_MEMORY;

  return result;
}